

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O3

void __thiscall gui::TextBox::handleMousePress(TextBox *this,Button button,Vector2f *mouseParent)

{
  String *string;
  element_type *peVar1;
  Vector2f VVar2;
  Transform *this_00;
  Vector2f *pVVar3;
  size_t sVar4;
  size_t index;
  size_t sVar5;
  float fVar6;
  float fVar7;
  Vector2f mouseLocal;
  float local_58;
  float fStack_54;
  Vector2<float> local_40;
  float local_34;
  
  Widget::handleMousePress(&this->super_Widget,button,mouseParent);
  this_00 = Widget::getInverseTransform(&this->super_Widget);
  VVar2 = sf::Transform::transformPoint(this_00,mouseParent);
  pVVar3 = Widget::getOrigin(&this->super_Widget);
  local_58 = VVar2.x;
  fStack_54 = VVar2.y;
  local_40.y = fStack_54 - (*pVVar3).y;
  local_40.x = local_58 - (*pVVar3).x;
  if ((int)button < 3) {
    Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
              (&this->onClick,&this->super_Widget,&local_40);
  }
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (&this->onMousePress,&this->super_Widget,button,&local_40);
  string = &this->visibleString_;
  sf::Text::setString(&((this->style_).
                        super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       text_,string);
  peVar1 = (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sf::Transformable::setPosition
            (&(peVar1->text_).super_Transformable,(peVar1->textPadding_).x,(peVar1->textPadding_).y)
  ;
  sf::String::getSize(string);
  fVar6 = 3.4028235e+38;
  sVar5 = 0;
  index = 0;
  do {
    fVar7 = local_40.x;
    local_34 = fVar6;
    pVVar3 = Widget::getOrigin(&this->super_Widget);
    fVar6 = pVVar3->x;
    VVar2 = sf::Text::findCharacterPos
                      (&((this->style_).
                         super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        text_,index);
    fVar7 = ABS((fVar7 + fVar6) - VVar2.x);
    fVar6 = local_34;
    if (fVar7 < local_34) {
      sVar5 = index;
      fVar6 = fVar7;
    }
    index = index + 1;
    sVar4 = sf::String::getSize(string);
  } while (index <= sVar4);
  updateCaretPosition(this,sVar5 + this->horizontalScroll_);
  return;
}

Assistant:

void TextBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button <= sf::Mouse::Middle) {
        onClick.emit(this, mouseLocal);
    }
    onMousePress.emit(this, button, mouseLocal);

    style_->text_.setString(visibleString_);
    style_->text_.setPosition(style_->textPadding_.x, style_->textPadding_.y);
    size_t closestIndex = 0;
    float closestDistance = std::numeric_limits<float>::max();
    for (size_t i = 0; i <= visibleString_.getSize(); ++i) {
        float distance = fabs(mouseLocal.x + getOrigin().x - style_->text_.findCharacterPos(i).x);
        if (distance < closestDistance) {
            closestIndex = i;
            closestDistance = distance;
        }
    }
    GUI_DEBUG << "mouseLocal.x = " << mouseLocal.x << ", closest = " << closestIndex << ", " << closestDistance << "\n";
    updateCaretPosition(closestIndex + horizontalScroll_);
}